

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O1

void tcg_gen_smin_i32_ppc(TCGContext_conflict9 *tcg_ctx,TCGv_i32 ret,TCGv_i32 a,TCGv_i32 b)

{
  TCGOp *pTVar1;
  uintptr_t o_2;
  uintptr_t o_1;
  uintptr_t o;
  
  pTVar1 = tcg_emit_op_ppc(tcg_ctx,INDEX_op_movcond_i32);
  pTVar1->args[0] = (TCGArg)(ret + (long)tcg_ctx);
  pTVar1->args[1] = (TCGArg)(a + (long)tcg_ctx);
  pTVar1->args[2] = (TCGArg)(b + (long)tcg_ctx);
  pTVar1->args[3] = (TCGArg)(a + (long)tcg_ctx);
  pTVar1->args[4] = (TCGArg)(b + (long)tcg_ctx);
  pTVar1->args[5] = 2;
  return;
}

Assistant:

void tcg_gen_smin_i32(TCGContext *tcg_ctx, TCGv_i32 ret, TCGv_i32 a, TCGv_i32 b)
{
    tcg_gen_movcond_i32(tcg_ctx, TCG_COND_LT, ret, a, b, a, b);
}